

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O3

void __thiscall uWS::DeflationStream::DeflationStream(DeflationStream *this,int compressOptions)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  (this->deflationStream).next_in = (Bytef *)0x0;
  (this->deflationStream).avail_in = 0;
  (this->deflationStream).total_in = 0;
  (this->deflationStream).next_out = (Bytef *)0x0;
  (this->deflationStream).avail_out = 0;
  (this->deflationStream).total_out = 0;
  (this->deflationStream).msg = (char *)0x0;
  (this->deflationStream).state = (internal_state *)0x0;
  (this->deflationStream).zalloc = (alloc_func)0x0;
  (this->deflationStream).zfree = (free_func)0x0;
  (this->deflationStream).opaque = (voidpf)0x0;
  (this->deflationStream).data_type = 0;
  (this->deflationStream).adler = 0;
  (this->deflationStream).reserved = 0;
  if (compressOptions < 0x42) {
    if (compressOptions < 0x12) {
      uVar2 = 1;
      uVar1 = 0xfffffff7;
      if (compressOptions == 6) goto LAB_0014086b;
      if (compressOptions == 10) {
        uVar2 = 2;
        goto LAB_0014086b;
      }
    }
    else {
      if (compressOptions == 0x12) {
        uVar2 = 3;
        uVar1 = 0xfffffff6;
        goto LAB_0014086b;
      }
      if (compressOptions == 0x22) {
        uVar2 = 4;
        uVar1 = 0xfffffff5;
        goto LAB_0014086b;
      }
    }
  }
  else if (compressOptions < 0x102) {
    if (compressOptions == 0x42) {
      uVar2 = 5;
      uVar1 = 0xfffffff4;
      goto LAB_0014086b;
    }
    if (compressOptions == 0x82) {
      uVar2 = 6;
      uVar1 = 0xfffffff3;
      goto LAB_0014086b;
    }
  }
  else if (compressOptions == 0x102) {
    uVar2 = 7;
    uVar1 = 0xfffffff2;
    goto LAB_0014086b;
  }
  uVar2 = 8;
  uVar1 = 0xfffffff1;
LAB_0014086b:
  deflateInit2_(this,1,8,uVar1,uVar2,0,"1.2.11",0x70,0);
  return;
}

Assistant:

DeflationStream(int compressOptions) {

        /* Sliding inflator should be about 44kb by default, less than compressor */

        /* Memory usage is given by 2 ^ (windowBits + 2) + 2 ^ (memLevel + 9) */
        int windowBits = -15, memLevel = 8;

        if (compressOptions == DEDICATED_COMPRESSOR_3KB) {
            windowBits = -9;
            memLevel = 1;
        } else if (compressOptions == DEDICATED_COMPRESSOR_4KB) {
            windowBits = -9;
            memLevel = 2;
        } else if (compressOptions == DEDICATED_COMPRESSOR_8KB) {
            windowBits = -10;
            memLevel = 3;
        } else if (compressOptions == DEDICATED_COMPRESSOR_16KB) {
            windowBits = -11;
            memLevel = 4;
        } else if (compressOptions == DEDICATED_COMPRESSOR_32KB) {
            windowBits = -12;
            memLevel = 5;
        } else if (compressOptions == DEDICATED_COMPRESSOR_64KB) {
            windowBits = -13;
            memLevel = 6;
        } else if (compressOptions == DEDICATED_COMPRESSOR_128KB) {
            windowBits = -14;
            memLevel = 7;
        } else if (compressOptions == DEDICATED_COMPRESSOR_256KB) {
            windowBits = -15;
            memLevel = 8;
        }

        /* DEDICATED_COMPRESSOR_256KB is the same as DEDICATED_COMPRESSOR */

        deflateInit2(&deflationStream, 1, Z_DEFLATED, windowBits, memLevel, Z_DEFAULT_STRATEGY);
    }